

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarIntG8IU.h
# Opt level: O0

uint32_t * __thiscall
FastPForLib::VarIntG8IU::decodeArray
          (VarIntG8IU *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  undefined8 *in_RCX;
  undefined1 (*pauVar5) [16];
  long in_RDX;
  byte *in_RSI;
  long in_RDI;
  long *in_R8;
  __m128i result2_1;
  int readSize_1;
  __m128i result_1;
  __m128i data_1;
  char buff [32];
  uchar desc_1;
  __m128i result2;
  int readSize;
  __m128i result;
  __m128i data;
  uchar desc;
  size_t srclength;
  uint32_t *dst;
  uint32_t *initdst;
  uchar *src;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  byte local_199;
  undefined1 local_198 [16];
  int local_17c;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  byte local_151;
  ulong local_150;
  undefined8 *local_148;
  undefined8 *local_140;
  byte *local_138;
  long *local_130;
  undefined8 *local_108;
  undefined1 (*local_100) [16];
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 *local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  undefined8 *local_8;
  
  local_148 = in_RCX;
  local_138 = in_RSI;
  for (local_150 = in_RDX << 2; local_140 = in_RCX, local_130 = in_R8, 0x15 < local_150;
      local_150 = local_150 - 9) {
    local_151 = *local_138;
    local_100 = (undefined1 (*) [16])(local_138 + 1);
    local_168 = vlddqu_avx(*local_100);
    pauVar5 = (undefined1 (*) [16])(in_RDI + 0x410 + (ulong)local_151 * 0x20);
    local_98 = *(undefined8 *)*pauVar5;
    uStack_90 = *(undefined8 *)(*pauVar5 + 8);
    local_88 = local_168._0_8_;
    uStack_80 = local_168._8_8_;
    local_178 = vpshufb_avx(local_168,*pauVar5);
    local_8 = local_148;
    local_18 = local_178._0_8_;
    uStack_10 = local_178._8_8_;
    *local_148 = local_178._0_8_;
    local_148[1] = local_178._8_8_;
    local_17c = *(int *)(in_RDI + 8 + (ulong)local_151 * 4);
    if (4 < local_17c) {
      lVar4 = in_RDI + (ulong)local_151 * 0x20;
      pauVar5 = (undefined1 (*) [16])(lVar4 + 0x420);
      local_b8 = *(undefined8 *)*pauVar5;
      uStack_b0 = *(undefined8 *)(lVar4 + 0x428);
      local_a8 = local_168._0_8_;
      uStack_a0 = local_168._8_8_;
      local_198 = vpshufb_avx(local_168,*pauVar5);
      local_20 = local_148 + 2;
      local_38 = local_198._0_8_;
      uStack_30 = local_198._8_8_;
      *local_20 = local_198._0_8_;
      local_148[3] = local_198._8_8_;
    }
    local_148 = (undefined8 *)((long)local_148 + (long)local_17c * 4);
    local_138 = local_138 + 9;
  }
  for (; 8 < local_150; local_150 = local_150 - 8) {
    local_199 = *local_138;
    local_138 = local_138 + 1;
    local_150 = local_150 - 1;
    local_108 = &local_1c8;
    auVar2._8_8_ = uStack_1c0;
    auVar2._0_8_ = *(undefined8 *)local_138;
    auVar2 = vlddqu_avx(auVar2);
    local_1d8 = auVar2._0_8_;
    uStack_1d0 = auVar2._8_8_;
    pauVar5 = (undefined1 (*) [16])(in_RDI + 0x410 + (ulong)local_199 * 0x20);
    local_d8 = *(undefined8 *)*pauVar5;
    uStack_d0 = *(undefined8 *)(*pauVar5 + 8);
    local_c8 = local_1d8;
    uStack_c0 = uStack_1d0;
    auVar3 = vpshufb_avx(auVar2,*pauVar5);
    local_40 = &local_1c8;
    local_1e8 = auVar3._0_8_;
    uStack_1e0 = auVar3._8_8_;
    local_58 = local_1e8;
    uStack_50 = uStack_1e0;
    local_1c8 = local_1e8;
    uStack_1c0 = uStack_1e0;
    iVar1 = *(int *)(in_RDI + 8 + (ulong)local_199 * 4);
    if (4 < iVar1) {
      lVar4 = in_RDI + (ulong)local_199 * 0x20;
      pauVar5 = (undefined1 (*) [16])(lVar4 + 0x420);
      local_f8 = *(undefined8 *)*pauVar5;
      uStack_f0 = *(undefined8 *)(lVar4 + 0x428);
      local_e8 = local_1d8;
      uStack_e0 = uStack_1d0;
      auVar2 = vpshufb_avx(auVar2,*pauVar5);
      local_60 = &local_1b8;
      local_208 = auVar2._0_8_;
      uStack_200 = auVar2._8_8_;
      local_78 = local_208;
      uStack_70 = uStack_200;
      local_1b8 = local_208;
      uStack_1b0 = uStack_200;
    }
    memcpy(local_148,&local_1c8,(long)(iVar1 << 2));
    local_148 = (undefined8 *)((long)local_148 + (long)iVar1 * 4);
    local_138 = local_138 + 8;
  }
  *local_130 = (long)local_148 - (long)local_140 >> 2;
  return (uint32_t *)((ulong)(local_138 + 3) & 0xfffffffffffffffc);
}

Assistant:

const uint32_t *decodeArray(const uint32_t *in, const size_t length,
                              uint32_t *out, size_t &nvalue) {

    const unsigned char *src = reinterpret_cast<const unsigned char *>(in);
    const uint32_t *const initdst = out;

    uint32_t *dst = out;
    size_t srclength = length * 4;
    for (; srclength >= 22; srclength -= 8, src += 8) {
      unsigned char desc = *src;
      src += 1;
      srclength -= 1;
      const __m128i data =
          _mm_lddqu_si128(reinterpret_cast<__m128i const *>(src));
      const __m128i result = _mm_shuffle_epi8(data, vecmask[desc][0]);
      _mm_storeu_si128(reinterpret_cast<__m128i *>(dst), result);
      int readSize = maskOutputSize[desc];

      if (readSize > 4) {
        const __m128i result2 = _mm_shuffle_epi8(
            data, vecmask[desc][1]); //__builtin_ia32_pshufb128(data, shf2);
        _mm_storeu_si128(
            reinterpret_cast<__m128i *>(dst + 4),
            result2); //__builtin_ia32_storedqu(dst + (16), result2);
      }
      dst += readSize;
    }
    while (srclength >= 9) {
      unsigned char desc = *src;
      src += 1;
      srclength -= 1;
      char buff[32];
      memcpy(buff, src, 8);
      const __m128i data =
          _mm_lddqu_si128(reinterpret_cast<__m128i const *>(buff));
      const __m128i result = _mm_shuffle_epi8(data, vecmask[desc][0]);
      _mm_storeu_si128(reinterpret_cast<__m128i *>(buff), result);
      int readSize = maskOutputSize[desc];
      if (readSize > 4) {
        const __m128i result2 = _mm_shuffle_epi8(data, vecmask[desc][1]);
        _mm_storeu_si128(reinterpret_cast<__m128i *>(buff + 16), result2);
      }
      memcpy(dst, buff, 4 * readSize);
      dst += readSize;
      srclength -= 8;
      src += 8;
    }

    nvalue = (dst - initdst);
    return reinterpret_cast<uint32_t *>((reinterpret_cast<uintptr_t>(src) + 3) &
                                        ~3);
  }